

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::addDepthBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  runtime_error *this_01;
  shared_ptr<polyscope::render::RenderBuffer> local_28;
  
  peVar1 = (renderBufferIn->
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    peVar1 = (element_type *)
             __dynamic_cast(peVar1,&RenderBuffer::typeinfo,&GLRenderBuffer::typeinfo,0);
    if (peVar1 != (element_type *)0x0) {
      this_00 = (renderBufferIn->
                super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      (*glad_glBindRenderbuffer)(0x8d41,*(GLuint *)&peVar1->field_0x14);
      checkGLError(true);
      (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
      (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,*(GLuint *)&peVar1->field_0x14);
      checkGLError(true);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_00;
      std::
      vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
      ::emplace_back<std::shared_ptr<polyscope::render::RenderBuffer>>
                ((vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
                  *)&(this->super_FrameBuffer).renderBuffersDepth,&local_28);
      if (local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.
                   super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return;
    }
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"tried to bind to non-GL render buffer");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addDepthBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {
  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  // Sanity checks
  // if (depthRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (depthTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderBuffer->getHandle());
  checkGLError();
  renderBuffersDepth.push_back(renderBuffer);
}